

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O2

void __thiscall RateCodingSynapse::update(RateCodingSynapse *this)

{
  pointer pdVar1;
  Population *pPVar2;
  size_type sVar3;
  double *pdVar4;
  _Map_pointer ppdVar5;
  double *pdVar6;
  int i;
  ulong uVar7;
  double dVar8;
  _func_int **pp_Var9;
  double currentTime;
  
  currentTime = Clock::getCurrentTime(this->clock);
  pp_Var9 = (_func_int **)0x0;
  uVar7 = 0;
  do {
    if ((long)this->inputSize <= (long)uVar7) {
      if (this->singleOutput != false) {
        pp_Var9 = (_func_int **)((double)pp_Var9 / (double)this->inputSize);
        (*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start)[1]._vptr_Event = pp_Var9;
        pPVar2 = (this->super_Synapse).to_population;
        (*pPVar2->_vptr_Population[5])(pPVar2,0);
        Logging::logValue(this->logger,(long)this,0,3,(double)pp_Var9);
      }
      return;
    }
    if ((((this->super_Synapse).from_population)->output).
        super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar7]->type == Spike) {
      std::deque<double,_std::allocator<double>_>::push_back
                ((this->spikes).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,&currentTime);
      Logging::logEvent(this->logger,1,(int)uVar7,0);
    }
    while( true ) {
      sVar3 = std::deque<double,_std::allocator<double>_>::size
                        ((this->spikes).
                         super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar7);
      pdVar1 = (this->spikes).
               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar3 == 0) break;
      dVar8 = currentTime - this->param->time_window;
      pdVar4 = pdVar1[uVar7].super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      if (dVar8 < *pdVar4 || dVar8 == *pdVar4) goto LAB_001205a7;
      std::deque<double,_std::allocator<double>_>::pop_front(pdVar1 + uVar7);
    }
    pdVar4 = pdVar1[uVar7].super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
LAB_001205a7:
    pdVar6 = pdVar1[uVar7].super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppdVar5 = pdVar1[uVar7].super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    while (pdVar4 != pdVar1[uVar7].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur) {
      pp_Var9 = (_func_int **)((double)pp_Var9 + 1.0);
      pdVar4 = pdVar4 + 1;
      if (pdVar4 == pdVar6) {
        pdVar4 = ppdVar5[1];
        ppdVar5 = ppdVar5 + 1;
        pdVar6 = pdVar4 + 0x40;
      }
    }
    if (this->singleOutput == false) {
      (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7][1]._vptr_Event = pp_Var9;
      pPVar2 = (this->super_Synapse).to_population;
      (*pPVar2->_vptr_Population[5])(pPVar2,uVar7 & 0xffffffff);
      Logging::logValue(this->logger,(long)this,(int)uVar7,3,(double)pp_Var9);
      pp_Var9 = (_func_int **)0x0;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void RateCodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    double value = 0.0;
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Spike) {
            spikes[i].push_back(currentTime);
            logger->logEvent(1, i, EventType::Spike);
        }
        while(spikes[i].size() && spikes[i].front() < currentTime - param->time_window) {
            spikes[i].pop_front(); 
        }
        for(double t : spikes[i]) {
            value += 1;
        }
        if(!singleOutput) {
            static_cast<ValueEvent*>(output[i])->setValue(value);
            to_population->setInput(i, output[i]);
            logger->logValue((long)this, i, EventType::Value, value);
            value = 0.0;
        }
    }
    value = value / (double)inputSize;
    if(singleOutput) {
        static_cast<ValueEvent*>(output[0])->setValue(value);
        to_population->setInput(0, output[0]);
        logger->logValue((long)this, 0, EventType::Value, value);
    }
}